

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qeasingcurve.cpp
# Opt level: O2

qreal __thiscall ElasticEase::value(ElasticEase *this,qreal t)

{
  Type TVar1;
  ulong uVar2;
  double dVar3;
  qreal qVar4;
  double dVar5;
  qreal c;
  double dVar6;
  double dVar7;
  double local_38;
  
  TVar1 = (this->super_QEasingCurveFunction)._t;
  if (3 < TVar1 - InElastic) {
    return t;
  }
  dVar6 = (this->super_QEasingCurveFunction)._p;
  uVar2 = -(ulong)(dVar6 < 0.0);
  dVar5 = (double)(~uVar2 & (ulong)dVar6 | uVar2 & 0x3fd3333333333333);
  dVar6 = (this->super_QEasingCurveFunction)._a;
  uVar2 = -(ulong)(dVar6 < 0.0);
  local_38 = (double)(~uVar2 & (ulong)dVar6 | uVar2 & 0x3ff0000000000000);
  switch(TVar1) {
  case InElastic:
    c = 1.0;
    qVar4 = 0.0;
    break;
  case OutElastic:
    qVar4 = 1.0;
LAB_0039c607:
    qVar4 = easeOutElastic_helper(t,qVar4,local_38,dVar5,local_38,dVar5);
    return qVar4;
  case InOutElastic:
    if ((t == 0.0) && (!NAN(t))) {
      return 0.0;
    }
    dVar6 = t + t;
    if ((dVar6 == 2.0) && (!NAN(dVar6))) {
      return 1.0;
    }
    if (1.0 <= local_38) {
      dVar3 = asin(1.0 / local_38);
      dVar3 = dVar3 * (dVar5 / 6.283185307179586);
    }
    else {
      dVar3 = dVar5 * 0.25;
      local_38 = 1.0;
    }
    dVar7 = dVar6 + -1.0;
    dVar5 = ((dVar7 - dVar3) * 6.283185307179586) / dVar5;
    if (dVar6 < 1.0) {
      dVar6 = exp2(dVar7 * 10.0);
      dVar5 = sin(dVar5);
      return dVar5 * local_38 * dVar6 * -0.5;
    }
    dVar6 = exp2(dVar7 * -10.0);
    dVar5 = sin(dVar5);
    return dVar5 * dVar6 * local_38 * 0.5 + 1.0;
  case OutInElastic:
    if (t < 0.5) {
      t = t + t;
      qVar4 = 0.5;
      goto LAB_0039c607;
    }
    t = t + t + -1.0;
    qVar4 = 0.5;
    c = 0.5;
  }
  qVar4 = easeInElastic_helper(t,qVar4,c,local_38,dVar5,dVar5);
  return qVar4;
}

Assistant:

qreal value(qreal t) override
    {
        qreal p = (_p < 0) ? qreal(0.3) : _p;
        qreal a = (_a < 0) ? qreal(1.0) : _a;
        switch (_t) {
        case QEasingCurve::InElastic:
            return easeInElastic(t, a, p);
        case QEasingCurve::OutElastic:
            return easeOutElastic(t, a, p);
        case QEasingCurve::InOutElastic:
            return easeInOutElastic(t, a, p);
        case QEasingCurve::OutInElastic:
            return easeOutInElastic(t, a, p);
        default:
            return t;
        }
    }